

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week9-hw.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  pointer pSVar1;
  bool bVar2;
  ostream *poVar3;
  pointer __str;
  Student *item;
  pointer pSVar4;
  Students local_98;
  pointer local_80;
  Students local_78;
  vector<Student,_std::allocator<Student>_> local_58;
  
  local_80 = courses.super__Vector_base<Course,_std::allocator<Course>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (__str = courses.super__Vector_base<Course,_std::allocator<Course>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
               super__Vector_impl_data._M_finish, __str != local_80; __str = __str + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Course Code is ");
    poVar3 = std::operator<<(poVar3,(string *)__str);
    std::endl<char,std::char_traits<char>>(poVar3);
    pSVar1 = students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    for (pSVar4 = students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
                  super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
      std::__cxx11::string::string((string *)&local_58,&__str->code);
      bVar2 = contains<std::vector<CourseGrade,std::allocator<CourseGrade>>,Student::has_taken_course(std::__cxx11::string)const::_lambda(CourseGrade_const&)_1_>
                        (&pSVar4->course_grades,(CourseCode *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (bVar2) {
        std::vector<Student,_std::allocator<Student>_>::push_back(&local_98,pSVar4);
      }
    }
    local_78.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_start = local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_78.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_78.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<Student,_std::allocator<Student>_>::~vector(&local_98);
    print(&local_78);
    std::vector<Student,_std::allocator<Student>_>::~vector(&local_78);
  }
  local_58.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (pSVar4 = students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    if (2 < (ulong)(((long)(pSVar4->course_grades).
                           super__Vector_base<CourseGrade,_std::allocator<CourseGrade>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pSVar4->course_grades).
                          super__Vector_base<CourseGrade,_std::allocator<CourseGrade>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x28)) {
      std::vector<Student,_std::allocator<Student>_>::push_back(&local_58,pSVar4);
    }
  }
  local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_start = local_58.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_58.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_58.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Student,_std::allocator<Student>_>::~vector(&local_58);
  print(&local_98);
  std::vector<Student,_std::allocator<Student>_>::~vector(&local_98);
  return 0;
}

Assistant:

int main(int, char*[])
{
    // use filter algorithm on students for filtering the students
    // who has taken CS401 course before, then write the names of the students with print(v1)
    for(const auto& course : courses)
    {
        cout << "Course Code is " << course.code << endl;
        auto v1 = filter(students, [&](const Student& s) {
            return s.has_taken_course(course.code);
        });
        print(v1);
    }

    // use filter algorithm on students for filtering the students
    // who has taken at least 3 courses before, then write the names of the students with print(v2)
    auto v2 = filter(students, [](const Student& s) {
        return s.num_taken_courses() >= 3;
    });
    print(v2);

    return 0;
}